

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O3

void msd_lsd_adaptive<8u>(Cacheblock<8U> *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  bool bVar2;
  uchar *puVar3;
  void *__src;
  long lVar4;
  Cacheblock<8U> *pCVar5;
  size_t sVar6;
  size_t sVar7;
  ushort uVar8;
  ulong N_00;
  ulong uVar9;
  uchar *puVar10;
  long alStack_80038 [65537];
  
  N_00 = N;
  if (0xffff < N) {
    do {
      fill_cache<8u>(cache,N_00,depth);
      puVar10 = (cache->chars)._M_elems + 7;
      uVar9 = 7;
      do {
        memset(alStack_80038,0,0x80000);
        puVar3 = puVar10;
        sVar6 = N_00;
        do {
          alStack_80038[(ushort)(*(ushort *)(puVar3 + -1) << 8 | *(ushort *)(puVar3 + -1) >> 8)] =
               alStack_80038
               [(ushort)(*(ushort *)(puVar3 + -1) << 8 | *(ushort *)(puVar3 + -1) >> 8)] + 1;
          puVar3 = puVar3 + 0x10;
          sVar6 = sVar6 - 1;
        } while (sVar6 != 0);
        __src = malloc(N_00 << 4);
        msd_lsd_adaptive<8U>::bucketindex[0] = 0;
        lVar4 = 0;
        sVar6 = 0;
        do {
          sVar6 = sVar6 + alStack_80038[lVar4];
          msd_lsd_adaptive<8U>::bucketindex[lVar4 + 1] = sVar6;
          lVar4 = lVar4 + 1;
          pCVar5 = cache;
          sVar7 = N_00;
        } while (lVar4 != 0xffff);
        do {
          uVar8 = *(ushort *)((pCVar5->chars)._M_elems + (uVar9 - 1));
          uVar8 = uVar8 << 8 | uVar8 >> 8;
          sVar6 = msd_lsd_adaptive<8U>::bucketindex[uVar8];
          msd_lsd_adaptive<8U>::bucketindex[uVar8] = sVar6 + 1;
          puVar3 = pCVar5->ptr;
          puVar1 = (undefined8 *)((long)__src + sVar6 * 0x10);
          *puVar1 = *(undefined8 *)(pCVar5->chars)._M_elems;
          puVar1[1] = puVar3;
          sVar7 = sVar7 - 1;
          pCVar5 = pCVar5 + 1;
        } while (sVar7 != 0);
        memcpy(cache,__src,N_00 << 4);
        free(__src);
        puVar10 = puVar10 + -2;
        bVar2 = 2 < uVar9;
        uVar9 = uVar9 - 2;
      } while (bVar2);
      if (N_00 == 1) {
        return;
      }
      depth = depth + 8;
      sVar7 = 1;
      N = 1;
      sVar6 = 0;
      pCVar5 = cache;
      do {
        if (*(long *)(pCVar5->chars)._M_elems == *(long *)pCVar5[1].chars._M_elems) {
          N = N + 1;
        }
        else {
          if ((1 < N) && (cache[sVar6].chars._M_elems[7] != '\0')) {
            msd_lsd_adaptive<8u>(cache + sVar6,N,depth);
          }
          N = 1;
          sVar6 = sVar7;
        }
        sVar7 = sVar7 + 1;
        pCVar5 = pCVar5 + 1;
      } while (N_00 != sVar7);
      if (N < 2) {
        return;
      }
      if (cache[sVar6].chars._M_elems[7] == '\0') {
        return;
      }
      cache = cache + sVar6;
      N_00 = N;
    } while (0xffff < N);
  }
  msd_lsd<8u>(cache,N,depth);
  return;
}

Assistant:

static void
msd_lsd_adaptive(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars%2==0, "CachedChars%2==0");
	static_assert(CachedChars>=2,   "CachedChars>=2");
	if (N < 0x10000) {
		msd_lsd(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte > 0; byte -= 2) {
		size_t bucketsize[0x10000] = {0};
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			++bucketsize[bucket];
		}
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		static size_t bucketindex[0x10000];
		bucketindex[0] = 0;
		for (size_t i=1; i < 0x10000; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i) {
			uint16_t bucket =
				(cache[i].chars[byte-1] << 8) | cache[i].chars[byte];
			memcpy(&sorted[bucketindex[bucket]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		}
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd_adaptive(cache+start, cnt, depth+CachedChars);
	}
}